

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

int Bac_BoxBoNum(Bac_Ntk_t *p,int i)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = Bac_ObjIsBox(p,i);
  if (iVar1 == 0) {
    __assert_fail("Bac_ObjIsBox(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x131,"int Bac_BoxBoNum(Bac_Ntk_t *, int)");
  }
  iVar1 = 0;
  do {
    iVar3 = iVar1;
    iVar1 = i + 1 + iVar3;
    if ((p->vType).nSize <= iVar1) {
      return iVar3;
    }
    iVar2 = Bac_ObjIsBo(p,iVar1);
    iVar1 = iVar3 + 1;
  } while (iVar2 != 0);
  return iVar3;
}

Assistant:

static inline int            Bac_BoxBoNum( Bac_Ntk_t * p, int i )            { int s = i+1; assert(Bac_ObjIsBox(p, i)); while (++i < Bac_NtkObjNum(p) && Bac_ObjIsBo(p, i)) {} return i - s;  }